

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

void __thiscall
chrono::turtlebot::Turtlebot_PassiveWheel::Turtlebot_PassiveWheel
          (Turtlebot_PassiveWheel *this,string *name,bool fixed,
          shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system,ChVector<double> *body_pos,
          ChQuaternion<double> *body_rot,shared_ptr<chrono::ChBodyAuxRef> chassis,bool collide)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  undefined1 auVar4 [16];
  shared_ptr<chrono::ChBodyAuxRef> local_38;
  shared_ptr<chrono::ChMaterialSurface> local_28;
  
  local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var2 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_38.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)
        chassis.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        (chassis.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8);
  lVar3 = *(long *)(chassis.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 8);
  if (lVar3 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
    }
  }
  Turtlebot_Part::Turtlebot_Part
            (&this->super_Turtlebot_Part,name,fixed,&local_28,system,body_pos,body_rot,&local_38,
             chassis.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._0_1_);
  if (local_38.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Turtlebot_Part)._vptr_Turtlebot_Part = (_func_int **)&PTR__Turtlebot_Part_0017f450;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Turtlebot_Part).m_mesh_name,0,
             (char *)(this->super_Turtlebot_Part).m_mesh_name._M_string_length,0x16d01e);
  auVar4._8_4_ = 0x3ecccccd;
  auVar4._0_8_ = 0x3ecccccd3ecccccd;
  auVar4._12_4_ = 0x3ecccccd;
  (this->super_Turtlebot_Part).m_offset.m_data[2] = 0.0;
  (this->super_Turtlebot_Part).m_offset.m_data[0] = 0.0;
  (this->super_Turtlebot_Part).m_offset.m_data[1] = 0.0;
  uVar1 = vmovlps_avx(auVar4);
  (this->super_Turtlebot_Part).m_color.R = (float)(int)uVar1;
  (this->super_Turtlebot_Part).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_Turtlebot_Part).m_color.B = 0.7;
  (this->super_Turtlebot_Part).m_density = 200.0;
  return;
}

Assistant:

Turtlebot_PassiveWheel::Turtlebot_PassiveWheel(const std::string& name,
                                               bool fixed,
                                               std::shared_ptr<ChMaterialSurface> mat,
                                               ChSystem* system,
                                               const ChVector<>& body_pos,
                                               const ChQuaternion<>& body_rot,
                                               std::shared_ptr<ChBodyAuxRef> chassis,
                                               bool collide)
    : Turtlebot_Part(name, fixed, mat, system, body_pos, body_rot, chassis, collide) {
    m_mesh_name = "passive_wheel";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.4f, 0.4f, 0.7f);
    m_density = 200;
}